

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O1

void swrenderer::R_InitTextureMapping(void)

{
  int iVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  double dVar7;
  double __x;
  double dVar8;
  
  dVar2 = FocalTangent;
  FocalLengthX = CenterX / FocalTangent;
  FocalLengthY = FocalLengthX * YaspectMul;
  dVar7 = tan(FieldOfView.Degrees * 0.008726646259971648);
  iVar1 = centerx;
  iVar6 = viewwidth;
  viewingrangerecip = SUB84(1.0 / dVar7 + 103079215104.0,0);
  lVar3 = (long)centerx;
  if (centerx <= viewwidth) {
    dVar7 = (double)centerx;
    iVar4 = viewwidth - centerx;
    __x = 0.0;
    lVar5 = 0;
    do {
      dVar8 = atan(__x);
      (&xtoviewangle)[lVar5 + lVar3] = (int)(long)(dVar8 * -683565275.5764316 + 4294967296.0);
      __x = __x + dVar2 / dVar7;
      lVar5 = lVar5 + 1;
    } while (iVar4 + 1 != (int)lVar5);
  }
  if (0 < iVar1) {
    lVar5 = 0;
    do {
      iVar6 = iVar6 + -1;
      *(undefined4 *)((long)&xtoviewangle + lVar5) = -(&xtoviewangle)[iVar6];
      lVar5 = lVar5 + 4;
    } while (lVar3 * 4 != lVar5);
  }
  return;
}

Assistant:

void R_InitTextureMapping ()
{
	int i;

	// Calc focallength so FieldOfView angles cover viewwidth.
	FocalLengthX = CenterX / FocalTangent;
	FocalLengthY = FocalLengthX * YaspectMul;

	// This is 1/FocalTangent before the widescreen extension of FOV.
	viewingrangerecip = FLOAT2FIXED(1. / tan(FieldOfView.Radians() / 2));


	// Now generate xtoviewangle for sky texture mapping.
	// [RH] Do not generate viewangletox, because texture mapping is no
	// longer done with trig, so it's not needed.
	const double slopestep = FocalTangent / centerx;
	double slope;

	for (i = centerx, slope = 0; i <= viewwidth; i++, slope += slopestep)
	{
		xtoviewangle[i] = angle_t((2 * M_PI - atan(slope)) * (ANGLE_180 / M_PI));
	}
	for (i = 0; i < centerx; i++)
	{
		xtoviewangle[i] = 0 - xtoviewangle[viewwidth - i - 1];
	}
}